

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase153::TestCase153(TestCase153 *this)

{
  TestCase153 *this_local;
  
  kj::TestCase::TestCase
            (&this->super_TestCase,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
             ,0x99,"legacy test: Orphans/Data");
  (this->super_TestCase)._vptr_TestCase = (_func_int **)&PTR_run_0058bab8;
  return;
}

Assistant:

TEST(Orphans, Data) {
  MallocMessageBuilder builder;
  auto root = builder.initRoot<TestAllTypes>();

  root.setDataField(data("foo"));
  EXPECT_TRUE(root.hasDataField());

  Orphan<Data> orphan = root.disownDataField();
  EXPECT_FALSE(orphan == nullptr);

  EXPECT_EQ(data("foo"), orphan.getReader());
  EXPECT_EQ(data("foo"), orphan.get());
  EXPECT_FALSE(root.hasDataField());

  root.adoptDataField(kj::mv(orphan));
  EXPECT_TRUE(orphan == nullptr);
  EXPECT_TRUE(root.hasDataField());
  EXPECT_EQ(data("foo"), root.getDataField());
}